

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_monster_base(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *name;
  monster_base *pmVar3;
  
  pvVar2 = parser_priv(p);
  name = parser_getsym(p,"base");
  pmVar3 = lookup_monster_base(name);
  *(monster_base **)((long)pvVar2 + 0x28) = pmVar3;
  if (pmVar3 == (monster_base *)0x0) {
    pVar1 = PARSE_ERROR_INVALID_MONSTER_BASE;
  }
  else {
    *(wchar_t *)((long)pvVar2 + 0x8c) = pmVar3->d_char;
    flag_union((bitflag *)((long)pvVar2 + 0x5c),pmVar3->flags,0xb);
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_monster_base(struct parser *p) {
	struct monster_race *r = parser_priv(p);

	r->base = lookup_monster_base(parser_getsym(p, "base"));
	if (r->base == NULL)
		return PARSE_ERROR_INVALID_MONSTER_BASE;

	/* The template sets the default display character */
	r->d_char = r->base->d_char;

	/* Give the monster its default flags */
	rf_union(r->flags, r->base->flags);

	return PARSE_ERROR_NONE;
}